

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void __thiscall Namespace<false>::AddFeature(Namespace<false> *this,vw *all,char *str)

{
  uint64_t i;
  char *in_RDX;
  long in_RDI;
  features *this_00;
  uint64_t in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  vw *in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  this_00 = *(features **)(in_RDI + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RDX,(allocator *)&stack0xffffffffffffffc7);
  i = VW::hash_feature(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                      );
  features::push_back(this_00,(feature_value)((ulong)in_RDI >> 0x20),i);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void AddFeature(vw* all, const char* str)
  {
    ftrs->push_back(1., VW::hash_feature(*all, str, namespace_hash));
    feature_count++;

    if (audit)
      ftrs->space_names.push_back(audit_strings_ptr(new audit_strings(name, str)));
  }